

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O0

void thread_guard(Fiber *self,void *arg)

{
  Thread *to;
  Thread *next;
  CleanupArgs *args;
  Thread *sched_thread;
  Sched *sched;
  Thread *th;
  void *arg_local;
  Fiber *self_local;
  
  sched = (Sched *)arg;
  th = (Thread *)arg;
  arg_local = self;
  if (the_thread == (Thread *)0x0) {
    fprintf(_stderr,"requirement not met: %s\n","the_thread");
    abort();
  }
  if ((Thread *)arg != the_thread) {
    fprintf(_stderr,"requirement not met: %s\n","th == the_thread");
    abort();
  }
  if (self != (Fiber *)((long)arg + 0x18)) {
    fprintf(_stderr,"requirement not met: %s\n","self == &th->fiber");
    abort();
  }
  args = *arg;
  sched_thread = (Thread *)args;
  fiber_reserve_return(&((Thread *)args)->fiber,thread_cleanup_cont,&next,8);
  next->sched = sched;
  to = (sched->main_thread).next;
  ((sched->main_thread).prev)->next = (sched->main_thread).next;
  ((sched->main_thread).next)->prev = (sched->main_thread).prev;
  thread_switch(&sched->main_thread,to);
  abort();
}

Assistant:

static void
thread_guard(Fiber *self, void *arg)
{
    Thread *th = (Thread *) arg;
    require(the_thread);
    require(th == the_thread);
    require(self == &th->fiber);
    (void) self;

    Sched *sched = th->sched;
    Thread *sched_thread = &sched->main_thread;
    CleanupArgs *args;

    fiber_reserve_return(
      &sched_thread->fiber, thread_cleanup_cont, (void **) &args, sizeof args);
    args->thread = th;

    Thread *next = th->next;
    // unlink ourself
    th->prev->next = th->next;
    th->next->prev = th->prev;
    thread_switch(th, next);
    // does not return here
    abort();
}